

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

void __thiscall
basisu::vector<basisu::vector<basisu::gpu_image>_>::~vector
          (vector<basisu::vector<basisu::gpu_image>_> *this)

{
  uint uVar1;
  void *__ptr;
  vector<basisu::gpu_image> *__ptr_00;
  long lVar2;
  vector<basisu::gpu_image> *pvVar3;
  gpu_image *__ptr_01;
  
  __ptr_00 = this->m_p;
  if (__ptr_00 != (vector<basisu::gpu_image> *)0x0) {
    if ((ulong)this->m_size != 0) {
      pvVar3 = __ptr_00 + this->m_size;
      do {
        __ptr_01 = __ptr_00->m_p;
        if (__ptr_01 != (gpu_image *)0x0) {
          uVar1 = __ptr_00->m_size;
          if ((ulong)uVar1 != 0) {
            lVar2 = 0;
            do {
              __ptr = *(void **)((long)&(__ptr_01->m_blocks).m_p + lVar2);
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              lVar2 = lVar2 + 0x30;
            } while ((ulong)uVar1 * 0x30 != lVar2);
            __ptr_01 = __ptr_00->m_p;
          }
          free(__ptr_01);
        }
        __ptr_00 = __ptr_00 + 1;
      } while (__ptr_00 != pvVar3);
      __ptr_00 = this->m_p;
    }
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }